

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O1

int __thiscall
TPZSkylNSymMatrix<float>::Subst_LForward(TPZSkylNSymMatrix<float> *this,TPZFMatrix<float> *B)

{
  char cVar1;
  float **ppfVar2;
  float *pfVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar5;
  int iVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  float fVar12;
  long local_48;
  
  lVar9 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar6 = 0;
  if ((lVar9 == CONCAT44(extraout_var,iVar4)) &&
     ((cVar1 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed, cVar1 == '\x04' ||
      (cVar1 == '\x01')))) {
    iVar4 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    iVar6 = 1;
    if (CONCAT44(extraout_var_00,iVar4) != 0 && -1 < extraout_var_00) {
      local_48 = -4;
      lVar9 = 0;
      do {
        if (0 < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) {
          lVar10 = 0;
          lVar8 = 0;
          do {
            ppfVar2 = (this->fElemb).fStore;
            pfVar3 = ppfVar2[lVar9 + 1];
            if ((B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar9) {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
            pfVar11 = ppfVar2[lVar9] + 1;
            fVar12 = 0.0;
            if (pfVar11 < pfVar3) {
              pfVar7 = (float *)((long)B->fElem + lVar5 * lVar10 + local_48);
              do {
                fVar12 = fVar12 + *pfVar11 * *pfVar7;
                pfVar11 = pfVar11 + 1;
                pfVar7 = pfVar7 + -1;
              } while (pfVar11 < pfVar3);
            }
            if ((lVar5 <= lVar9) || ((B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar8))
            {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow * lVar8;
            B->fElem[lVar5 + lVar9] = B->fElem[lVar5 + lVar9] - fVar12;
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 4;
          } while (lVar8 < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol);
        }
        lVar9 = lVar9 + 1;
        local_48 = local_48 + 4;
      } while (lVar9 != CONCAT44(extraout_var_00,iVar4));
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}